

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,EffectAnalyzer *param_1)

{
  Module *pMVar1;
  size_t sVar2;
  bool bVar3;
  undefined6 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined4 uVar16;
  EffectAnalyzer *param_1_local;
  EffectAnalyzer *this_local;
  
  *(undefined8 *)((long)&this->module + 6) = *(undefined8 *)((long)&param_1->module + 6);
  bVar3 = param_1->trapsNeverHappen;
  uVar4 = *(undefined6 *)&param_1->field_0x2;
  pMVar1 = param_1->module;
  this->ignoreImplicitTraps = param_1->ignoreImplicitTraps;
  this->trapsNeverHappen = bVar3;
  *(undefined6 *)&this->field_0x2 = uVar4;
  this->module = pMVar1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->localsRead,&param_1->localsRead);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->localsWritten,&param_1->localsWritten);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->mutableGlobalsRead,&param_1->mutableGlobalsRead);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->globalsWritten,&param_1->globalsWritten);
  *(undefined4 *)((long)&this->catchDepth + 7) = *(undefined4 *)((long)&param_1->catchDepth + 7);
  bVar3 = param_1->readsMemory;
  bVar5 = param_1->writesMemory;
  bVar6 = param_1->readsTable;
  bVar7 = param_1->writesTable;
  bVar8 = param_1->readsMutableStruct;
  bVar9 = param_1->writesStruct;
  bVar10 = param_1->readsArray;
  bVar11 = param_1->writesArray;
  bVar12 = param_1->trap;
  bVar13 = param_1->implicitTrap;
  bVar14 = param_1->isAtomic;
  bVar15 = param_1->throws_;
  uVar16 = *(undefined4 *)&param_1->field_0xe4;
  sVar2 = param_1->catchDepth;
  this->tryDepth = param_1->tryDepth;
  this->catchDepth = sVar2;
  this->readsMemory = bVar3;
  this->writesMemory = bVar5;
  this->readsTable = bVar6;
  this->writesTable = bVar7;
  this->readsMutableStruct = bVar8;
  this->writesStruct = bVar9;
  this->readsArray = bVar10;
  this->writesArray = bVar11;
  this->trap = bVar12;
  this->implicitTrap = bVar13;
  this->isAtomic = bVar14;
  this->throws_ = bVar15;
  *(undefined4 *)&this->field_0xe4 = uVar16;
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->breakTargets,&param_1->breakTargets);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->delegateTargets,&param_1->delegateTargets);
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen), module(module),
      features(module.features) {}